

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spawner.cpp
# Opt level: O0

void __thiscall
spawner::Spawner::
Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>
          (Spawner *this,vector<char,_std::allocator<char>_> *pRodata)

{
  char *__str;
  size_type __len;
  size_type sVar1;
  runtime_error *this_00;
  vector<char,_std::allocator<char>_> *this_01;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  anon_class_8_1_8991fb9c local_c8;
  anon_class_8_1_8991fb9c local_c0;
  anon_class_8_1_8991fb9c local_b8;
  anon_class_8_1_8991fb9c local_b0;
  anon_class_8_1_8991fb9c local_a8;
  anon_class_8_1_8991fb9c local_a0;
  anon_class_8_1_8991fb9c local_98;
  anon_class_8_1_8991fb9c local_90;
  anon_class_8_1_8991fb9c local_88;
  anon_class_8_1_8991fb9c local_80;
  anon_class_8_1_8991fb9c local_78;
  anon_class_8_1_8991fb9c local_70;
  anon_class_8_1_8991fb9c local_68;
  anon_class_8_1_8991fb9c local_60;
  anon_class_8_1_8991fb9c local_58;
  anon_class_8_1_8991fb9c local_50;
  anon_class_8_1_8991fb9c local_48;
  anon_class_8_1_8991fb9c local_40;
  anon_class_8_1_8991fb9c local_38;
  anon_class_8_1_8991fb9c local_30;
  anon_class_8_1_8991fb9c local_28;
  vector<char,_std::allocator<char>_> *local_20;
  vector<char,_std::allocator<char>_> *pRodata_local;
  Spawner *this_local;
  
  local_28.this = this;
  local_20 = pRodata;
  pRodata_local = (vector<char,_std::allocator<char>_> *)this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_1_,void>
            ((function<void()> *)this,&local_28);
  local_30.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_2_,void>
            ((function<void()> *)((this->fn)._M_elems + 1),&local_30);
  local_38.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_3_,void>
            ((function<void()> *)((this->fn)._M_elems + 2),&local_38);
  local_40.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_4_,void>
            ((function<void()> *)((this->fn)._M_elems + 3),&local_40);
  local_48.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_5_,void>
            ((function<void()> *)((this->fn)._M_elems + 4),&local_48);
  local_50.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_6_,void>
            ((function<void()> *)((this->fn)._M_elems + 5),&local_50);
  local_58.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_7_,void>
            ((function<void()> *)((this->fn)._M_elems + 6),&local_58);
  local_60.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_8_,void>
            ((function<void()> *)((this->fn)._M_elems + 7),&local_60);
  local_68.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_9_,void>
            ((function<void()> *)((this->fn)._M_elems + 8),&local_68);
  local_70.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_10_,void>
            ((function<void()> *)((this->fn)._M_elems + 9),&local_70);
  local_78.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_11_,void>
            ((function<void()> *)((this->fn)._M_elems + 10),&local_78);
  local_80.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_12_,void>
            ((function<void()> *)((this->fn)._M_elems + 0xb),&local_80);
  local_88.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_13_,void>
            ((function<void()> *)((this->fn)._M_elems + 0xc),&local_88);
  local_90.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_14_,void>
            ((function<void()> *)((this->fn)._M_elems + 0xd),&local_90);
  local_98.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_15_,void>
            ((function<void()> *)((this->fn)._M_elems + 0xe),&local_98);
  local_a0.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_16_,void>
            ((function<void()> *)((this->fn)._M_elems + 0xf),&local_a0);
  local_a8.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_17_,void>
            ((function<void()> *)((this->fn)._M_elems + 0x10),&local_a8);
  local_b0.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_18_,void>
            ((function<void()> *)((this->fn)._M_elems + 0x11),&local_b0);
  local_b8.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_19_,void>
            ((function<void()> *)((this->fn)._M_elems + 0x12),&local_b8);
  local_c0.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_20_,void>
            ((function<void()> *)((this->fn)._M_elems + 0x13),&local_c0);
  local_c8.this = this;
  std::function<void()>::
  function<spawner::Spawner::Spawner<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>(std::vector<char,std::allocator<char>>&&,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul>)::_lambda()_21_,void>
            ((function<void()> *)((this->fn)._M_elems + 0x14),&local_c8);
  this_01 = &this->mRodata;
  std::vector<char,_std::allocator<char>_>::vector(this_01,local_20);
  this->mState = Logpoint;
  this->mReadSz = 0;
  __str = std::vector<char,_std::allocator<char>_>::data(this_01);
  __len = std::vector<char,_std::allocator<char>_>::size(this_01);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d8,__str,__len);
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_d8,"LoggerRefXD",0);
  this->mRefPos = sVar1;
  this->mLogPoint = (char *)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)&this->mSs);
  std::__cxx11::string::string((string *)&this->tokenFormat);
  if (this->mRefPos == 0xffffffffffffffff) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"LoggerRefXD not found in rodata");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

Spawner(std::vector<char>&& pRodata, std::integer_sequence<size_t, I...>)
        : fn({[this](){decodeParam(typename StateTraits<State(I)>::type());}...})
        , mRodata(std::move(pRodata))
        , mRefPos(std::string_view((char*)mRodata.data(), mRodata.size()).find("LoggerRefXD"))
    {
        if (std::string_view::npos == mRefPos)
            throw std::runtime_error("LoggerRefXD not found in rodata");
    }